

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl_sasl.c
# Opt level: O0

CURLcode get_server_message(SASL *sasl,Curl_easy *data,bufref *out)

{
  CURLcode local_3c;
  char *pcStack_38;
  CURLcode result;
  char *serverdata;
  size_t msglen;
  uchar *msg;
  bufref *out_local;
  Curl_easy *data_local;
  SASL *sasl_local;
  
  pcStack_38 = (char *)0x0;
  local_3c = CURLE_OK;
  msg = (uchar *)out;
  out_local = (bufref *)data;
  data_local = (Curl_easy *)sasl;
  (*sasl->params->getmessage)((data->state).buffer,&stack0xffffffffffffffc8);
  if (pcStack_38 == (char *)0x0) {
    local_3c = CURLE_BAD_CONTENT_ENCODING;
  }
  else if ((*pcStack_38 == '\0') || (*pcStack_38 == '=')) {
    Curl_bufref_set((bufref *)msg,(void *)0x0,0,(_func_void_void_ptr *)0x0);
  }
  else {
    local_3c = Curl_base64_decode(pcStack_38,(uchar **)&msglen,(size_t *)&serverdata);
    if (local_3c == CURLE_OK) {
      Curl_bufref_set((bufref *)msg,(void *)msglen,(size_t)serverdata,curl_free);
    }
  }
  return local_3c;
}

Assistant:

static CURLcode get_server_message(struct SASL *sasl, struct Curl_easy *data,
                                   struct bufref *out)
{
  unsigned char *msg;
  size_t msglen;
  char *serverdata = NULL;
  CURLcode result = CURLE_OK;

  sasl->params->getmessage(data->state.buffer, &serverdata);
  if(!serverdata)
    result = CURLE_BAD_CONTENT_ENCODING;
  else if(!*serverdata || *serverdata == '=')
    Curl_bufref_set(out, NULL, 0, NULL);
  else {
    result = Curl_base64_decode(serverdata, &msg, &msglen);
    if(!result)
      Curl_bufref_set(out, msg, msglen, curl_free);
  }
  return result;
}